

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_textedit_text(nk_text_edit *state,char *text,int total_len)

{
  nk_str *str;
  int iVar1;
  int iVar2;
  nk_rune *pnVar3;
  int iVar4;
  nk_rune unicode;
  int len;
  nk_rune local_50;
  nk_rune local_4c;
  nk_text_undo_state *local_48;
  char *local_40;
  int local_34;
  
  if (state == (nk_text_edit *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5625,"void nk_textedit_text(struct nk_text_edit *, const char *, int)");
  }
  if (text == (char *)0x0) {
    __assert_fail("text",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5626,"void nk_textedit_text(struct nk_text_edit *, const char *, int)");
  }
  if ((total_len != 0) && (state->mode != '\0')) {
    iVar1 = nk_utf_decode(text,&local_50,total_len);
    if (iVar1 != 0 && 0 < total_len) {
      str = &state->string;
      local_48 = &state->undo;
      iVar4 = 0;
      local_40 = text;
      do {
        if ((local_50 != 0x7f) && ((local_50 != 10 || (state->single_line == '\0')))) {
          if (state->filter != (nk_plugin_filter)0x0) {
            iVar2 = (*state->filter)(state,local_50);
            if (iVar2 == 0) goto LAB_00122e1e;
          }
          if ((state->select_start == state->select_end) &&
             (iVar2 = state->cursor, iVar2 < (state->string).len)) {
            if (state->mode == '\x02') {
              pnVar3 = nk_textedit_createundo(local_48,iVar2,1,1);
              if (pnVar3 != (nk_rune *)0x0) {
                local_4c = 0;
                nk_str_at_const(str,iVar2,&local_4c,&local_34);
                *pnVar3 = local_4c;
              }
              nk_str_delete_runes(str,state->cursor,1);
              iVar2 = state->cursor;
            }
            text = local_40;
            nk_str_insert_text_utf8(str,iVar2,local_40 + iVar4,1);
          }
          else {
            nk_textedit_delete_selection(state);
            text = local_40;
            nk_str_insert_text_utf8(str,state->cursor,local_40 + iVar4,1);
            nk_textedit_createundo(local_48,state->cursor,0,1);
          }
          state->cursor = state->cursor + 1;
          state->has_preferred_x = '\0';
        }
LAB_00122e1e:
        iVar4 = iVar4 + iVar1;
        iVar1 = nk_utf_decode(text + iVar4,&local_50,total_len - iVar4);
      } while ((iVar4 < total_len) && (iVar1 != 0));
    }
  }
  return;
}

Assistant:

NK_API void
nk_textedit_text(struct nk_text_edit *state, const char *text, int total_len)
{
    nk_rune unicode;
    int glyph_len;
    int text_len = 0;

    NK_ASSERT(state);
    NK_ASSERT(text);
    if (!text || !total_len || state->mode == NK_TEXT_EDIT_MODE_VIEW) return;

    glyph_len = nk_utf_decode(text, &unicode, total_len);
    while ((text_len < total_len) && glyph_len)
    {
        /* don't insert a backward delete, just process the event */
        if (unicode == 127) goto next;
        /* can't add newline in single-line mode */
        if (unicode == '\n' && state->single_line) goto next;
        /* filter incoming text */
        if (state->filter && !state->filter(state, unicode)) goto next;

        if (!NK_TEXT_HAS_SELECTION(state) &&
            state->cursor < state->string.len)
        {
            if (state->mode == NK_TEXT_EDIT_MODE_REPLACE) {
                nk_textedit_makeundo_replace(state, state->cursor, 1, 1);
                nk_str_delete_runes(&state->string, state->cursor, 1);
            }
            if (nk_str_insert_text_utf8(&state->string, state->cursor,
                                        text+text_len, 1))
            {
                ++state->cursor;
                state->has_preferred_x = 0;
            }
        } else {
            nk_textedit_delete_selection(state); /* implicitly clamps */
            if (nk_str_insert_text_utf8(&state->string, state->cursor,
                                        text+text_len, 1))
            {
                nk_textedit_makeundo_insert(state, state->cursor, 1);
                ++state->cursor;
                state->has_preferred_x = 0;
            }
        }
        next:
        text_len += glyph_len;
        glyph_len = nk_utf_decode(text + text_len, &unicode, total_len-text_len);
    }
}